

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O2

error_code __thiscall basisu::basis_compressor::encode_slices_to_uastc(basis_compressor *this)

{
  uint uVar1;
  vector<basisu::gpu_image> *this_00;
  vector<basisu::vector<unsigned_char>_> *this_01;
  uint16_vec *this_02;
  uint32_t uVar2;
  uint32_t uVar3;
  job_pool *pjVar4;
  vector<basisu::basisu_backend_slice_desc> *this_03;
  bool bVar5;
  uint16_t uVar6;
  gpu_image *pgVar7;
  basisu_backend_slice_desc *pbVar8;
  image *piVar9;
  uastc_block *pBlocks;
  pixel_block *pBlock_pixels;
  vector<unsigned_char> *pvVar10;
  uchar *__dest;
  uint64_t *puVar11;
  unsigned_short *puVar12;
  uint uVar13;
  uint32_t total_jobs;
  uint uVar14;
  uint uVar15;
  job_pool *pJob_pool;
  uint32_t slice_index;
  ulong uVar16;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  vector<basisu::basisu_backend_slice_desc> *local_90;
  gpu_image *local_88;
  uint32_t local_7c;
  uint32_t local_78;
  atomic<unsigned_int> total_blocks_processed;
  
  debug_printf("basis_compressor::encode_slices_to_uastc\n");
  this_00 = &this->m_uastc_slice_textures;
  local_90 = &this->m_slice_descs;
  vector<basisu::gpu_image>::resize(this_00,(ulong)(this->m_slice_descs).m_size,false);
  this_03 = local_90;
  for (uVar16 = 0; uVar16 < (this->m_slice_descs).m_size; uVar16 = uVar16 + 1) {
    pgVar7 = vector<basisu::gpu_image>::operator[](this_00,uVar16);
    vector<basisu::basisu_backend_slice_desc>::operator[](this_03,uVar16);
    vector<basisu::basisu_backend_slice_desc>::operator[](this_03,uVar16);
    gpu_image::init(pgVar7,(EVP_PKEY_CTX *)0x13);
  }
  (this->m_uastc_backend_output).m_tex_format = cUASTC4x4;
  (this->m_uastc_backend_output).m_etc1s = false;
  vector<basisu::basisu_backend_slice_desc>::operator=
            (&(this->m_uastc_backend_output).m_slice_desc,local_90);
  this_01 = &(this->m_uastc_backend_output).m_slice_image_data;
  vector<basisu::vector<unsigned_char>_>::resize(this_01,(ulong)(this->m_slice_descs).m_size,false);
  this_02 = &(this->m_uastc_backend_output).m_slice_image_crcs;
  vector<unsigned_short>::resize(this_02,(ulong)(this->m_slice_descs).m_size,false);
  uVar16 = 0;
  do {
    if ((this->m_slice_descs).m_size <= uVar16) {
      return cECSuccess;
    }
    pgVar7 = vector<basisu::gpu_image>::operator[](this_00,uVar16);
    pbVar8 = vector<basisu::basisu_backend_slice_desc>::operator[](local_90,uVar16);
    local_78 = pgVar7->m_blocks_x;
    local_7c = pgVar7->m_blocks_y;
    uVar15 = local_7c * local_78;
    local_88 = pgVar7;
    piVar9 = vector<basisu::image>::operator[](&this->m_slice_images,uVar16);
    LOCK();
    total_blocks_processed.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
    UNLOCK();
    uVar14 = 0;
    while (uVar14 < uVar15) {
      pjVar4 = (this->m_params).m_pJob_pool;
      local_a8 = (_Manager_type)0x0;
      uStack_a0 = (_Invoker_type)0x0;
      local_b8 = (undefined1  [8])0x0;
      _fStack_b0 = 0;
      local_b8 = (undefined1  [8])operator_new(0x38);
      uVar1 = uVar14 + 0x100;
      uVar13 = uVar1;
      if (uVar15 < uVar1) {
        uVar13 = uVar15;
      }
      *(basis_compressor **)local_b8 = this;
      *(uint *)((long)local_b8 + 8) = uVar14;
      *(uint *)((long)local_b8 + 0xc) = uVar13;
      *(uint32_t *)((long)local_b8 + 0x10) = local_78;
      *(uint32_t *)((long)local_b8 + 0x14) = local_7c;
      *(uint *)((long)local_b8 + 0x18) = uVar15;
      *(image **)((long)local_b8 + 0x20) = piVar9;
      *(gpu_image **)((long)local_b8 + 0x28) = local_88;
      *(atomic<unsigned_int> **)((long)local_b8 + 0x30) = &total_blocks_processed;
      uStack_a0 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp:306:35)>
                  ::_M_invoke;
      local_a8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp:306:35)>
                 ::_M_manager;
      job_pool::add_job(pjVar4,(function<void_()> *)local_b8);
      std::_Function_base::~_Function_base((_Function_base *)local_b8);
      uVar14 = uVar1;
    }
    job_pool::wait_for_all((this->m_params).m_pJob_pool);
    if ((this->m_params).m_rdo_uastc.m_value != false) {
      local_a8 = (code *)CONCAT71(local_a8._1_7_,1);
      fStack_ac = (this->m_params).m_rdo_uastc_skip_block_rms_thresh.m_value;
      fStack_b0 = (this->m_params).m_rdo_uastc_max_allowed_rms_increase_ratio.m_value;
      local_b8._4_4_ = (this->m_params).m_rdo_uastc_quality_scalar.m_value;
      local_b8._0_4_ = (this->m_params).m_rdo_uastc_dict_size.m_value;
      uStack_a0 = (code *)CONCAT44(100,(this->m_params).m_rdo_uastc_max_smooth_block_error_scale.
                                       m_value);
      local_a8 = (code *)CONCAT44((this->m_params).m_rdo_uastc_smooth_block_max_std_dev.m_value,
                                  (undefined4)local_a8);
      uVar2 = local_88->m_blocks_y;
      uVar3 = local_88->m_blocks_x;
      pBlocks = (uastc_block *)gpu_image::get_ptr(local_88);
      pBlock_pixels =
           vector<basisu::pixel_block>::operator[]
                     (&this->m_source_blocks,(ulong)pbVar8->m_first_block_index);
      bVar5 = (this->m_params).m_rdo_uastc_multithreading.m_value;
      pjVar4 = (this->m_params).m_pJob_pool;
      total_jobs = 0;
      pJob_pool = (job_pool *)0x0;
      if (bVar5 != false) {
        pJob_pool = pjVar4;
      }
      if (((pjVar4 != (job_pool *)0x0 & bVar5) == 1) &&
         (total_jobs = (int)((ulong)((long)(pjVar4->m_threads).
                                           super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pjVar4->m_threads).
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1,
         3 < total_jobs)) {
        total_jobs = 4;
      }
      bVar5 = uastc_rdo(uVar2 * uVar3,pBlocks,(color_rgba *)pBlock_pixels,
                        (uastc_rdo_params *)local_b8,(this->m_params).m_pack_uastc_flags,pJob_pool,
                        total_jobs);
      if (!bVar5) {
        return cECFailedUASTCRDOPostProcess;
      }
    }
    pvVar10 = vector<basisu::vector<unsigned_char>_>::operator[](this_01,uVar16);
    pgVar7 = local_88;
    vector<unsigned_char>::resize
              (pvVar10,(ulong)(local_88->m_blocks_x * local_88->m_blocks_y *
                               local_88->m_qwords_per_block * 8),false);
    pvVar10 = vector<basisu::vector<unsigned_char>_>::operator[](this_01,uVar16);
    __dest = vector<unsigned_char>::operator[](pvVar10,0);
    puVar11 = gpu_image::get_ptr(pgVar7);
    memcpy(__dest,puVar11,
           (ulong)(pgVar7->m_blocks_x * pgVar7->m_blocks_y * pgVar7->m_qwords_per_block * 8));
    puVar11 = gpu_image::get_ptr(pgVar7);
    uVar6 = basist::crc16(puVar11,(ulong)(pgVar7->m_blocks_x * pgVar7->m_blocks_y *
                                          pgVar7->m_qwords_per_block * 8),0);
    puVar12 = vector<unsigned_short>::operator[](this_02,uVar16);
    *puVar12 = uVar6;
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

basis_compressor::error_code basis_compressor::encode_slices_to_uastc()
	{
		debug_printf("basis_compressor::encode_slices_to_uastc\n");

		m_uastc_slice_textures.resize(m_slice_descs.size());
		for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
			m_uastc_slice_textures[slice_index].init(texture_format::cUASTC4x4, m_slice_descs[slice_index].m_orig_width, m_slice_descs[slice_index].m_orig_height);

		m_uastc_backend_output.m_tex_format = basist::basis_tex_format::cUASTC4x4;
		m_uastc_backend_output.m_etc1s = false;
		m_uastc_backend_output.m_slice_desc = m_slice_descs;
		m_uastc_backend_output.m_slice_image_data.resize(m_slice_descs.size());
		m_uastc_backend_output.m_slice_image_crcs.resize(m_slice_descs.size());
				
		for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
		{
			gpu_image& tex = m_uastc_slice_textures[slice_index];
			basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];
			(void)slice_desc;

			const uint32_t num_blocks_x = tex.get_blocks_x();
			const uint32_t num_blocks_y = tex.get_blocks_y();
			const uint32_t total_blocks = tex.get_total_blocks();
			const image& source_image = m_slice_images[slice_index];
			
			std::atomic<uint32_t> total_blocks_processed;
			total_blocks_processed = 0;

			const uint32_t N = 256;
			for (uint32_t block_index_iter = 0; block_index_iter < total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(total_blocks, block_index_iter + N);

				// FIXME: This sucks, but we're having a stack size related problem with std::function with emscripten.
#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index, num_blocks_x, num_blocks_y, total_blocks, &source_image, &tex, &total_blocks_processed]
					{
#endif
						BASISU_NOTE_UNUSED(num_blocks_y);
						
						uint32_t uastc_flags = m_params.m_pack_uastc_flags;
						if ((m_params.m_rdo_uastc) && (m_params.m_rdo_uastc_favor_simpler_modes_in_rdo_mode))
							uastc_flags |= cPackUASTCFavorSimplerModes;

						for (uint32_t block_index = first_index; block_index < last_index; block_index++)
						{
							const uint32_t block_x = block_index % num_blocks_x;
							const uint32_t block_y = block_index / num_blocks_x;

							color_rgba block_pixels[4][4];

							source_image.extract_block_clamped((color_rgba*)block_pixels, block_x * 4, block_y * 4, 4, 4);

							basist::uastc_block& dest_block = *(basist::uastc_block*)tex.get_block_ptr(block_x, block_y);

							encode_uastc(&block_pixels[0][0].r, dest_block, uastc_flags);

							total_blocks_processed++;
							
							uint32_t val = total_blocks_processed;
							if ((val & 16383) == 16383)
							{
								debug_printf("basis_compressor::encode_slices_to_uastc: %3.1f%% done\n", static_cast<float>(val) * 100.0f / total_blocks);
							}

						}

#ifndef __EMSCRIPTEN__
					});
#endif

			} // block_index_iter

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			if (m_params.m_rdo_uastc)
			{
				uastc_rdo_params rdo_params;
				rdo_params.m_lambda = m_params.m_rdo_uastc_quality_scalar;
				rdo_params.m_max_allowed_rms_increase_ratio = m_params.m_rdo_uastc_max_allowed_rms_increase_ratio;
				rdo_params.m_skip_block_rms_thresh = m_params.m_rdo_uastc_skip_block_rms_thresh;
				rdo_params.m_lz_dict_size = m_params.m_rdo_uastc_dict_size;
				rdo_params.m_smooth_block_max_error_scale = m_params.m_rdo_uastc_max_smooth_block_error_scale;
				rdo_params.m_max_smooth_block_std_dev = m_params.m_rdo_uastc_smooth_block_max_std_dev;
								
				bool status = uastc_rdo(tex.get_total_blocks(), (basist::uastc_block*)tex.get_ptr(),
					(const color_rgba *)m_source_blocks[slice_desc.m_first_block_index].m_pixels, rdo_params, m_params.m_pack_uastc_flags, m_params.m_rdo_uastc_multithreading ? m_params.m_pJob_pool : nullptr,
					(m_params.m_rdo_uastc_multithreading && m_params.m_pJob_pool) ? basisu::minimum<uint32_t>(4, (uint32_t)m_params.m_pJob_pool->get_total_threads()) : 0);
				if (!status)
				{
					return cECFailedUASTCRDOPostProcess;
				}
			}

			m_uastc_backend_output.m_slice_image_data[slice_index].resize(tex.get_size_in_bytes());
			memcpy(&m_uastc_backend_output.m_slice_image_data[slice_index][0], tex.get_ptr(), tex.get_size_in_bytes());
			
			m_uastc_backend_output.m_slice_image_crcs[slice_index] = basist::crc16(tex.get_ptr(), tex.get_size_in_bytes(), 0);
						
		} // slice_index
				
		return cECSuccess;
	}